

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall Catch::TagInfo::all_abi_cxx11_(TagInfo *this)

{
  StringRef rhs;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  size_type in_RSI;
  string *in_RDI;
  StringRef *spelling_1;
  iterator __end1_1;
  iterator __begin1_1;
  set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_> *__range1_1;
  StringRef *spelling;
  iterator __end1;
  iterator __begin1;
  set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_> *__range1;
  size_t size;
  string *out;
  set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
  *in_stack_ffffffffffffff58;
  string *psVar4;
  _Self local_68;
  _Self local_60 [4];
  undefined1 local_39;
  reference local_38;
  _Self local_30;
  _Self local_28 [2];
  long local_18;
  
  psVar4 = in_RDI;
  sVar2 = std::set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
          ::size((set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                  *)0x18bd66);
  local_18 = sVar2 << 1;
  local_28[0]._M_node =
       (_Base_ptr)
       std::set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>::
       begin(in_stack_ffffffffffffff58);
  local_30._M_node =
       (_Base_ptr)
       std::set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>::
       end(in_stack_ffffffffffffff58);
  while (bVar1 = std::operator!=(local_28,&local_30), bVar1) {
    local_38 = std::_Rb_tree_const_iterator<Catch::StringRef>::operator*
                         ((_Rb_tree_const_iterator<Catch::StringRef> *)0x18bdcd);
    sVar3 = StringRef::size(local_38);
    local_18 = sVar3 + local_18;
    std::_Rb_tree_const_iterator<Catch::StringRef>::operator++
              ((_Rb_tree_const_iterator<Catch::StringRef> *)in_RDI);
  }
  local_39 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::reserve((ulong)in_RDI);
  local_60[0]._M_node =
       (_Base_ptr)
       std::set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>::
       begin(in_stack_ffffffffffffff58);
  local_68._M_node =
       (_Base_ptr)
       std::set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>::
       end(in_stack_ffffffffffffff58);
  while (bVar1 = std::operator!=(local_60,&local_68), bVar1) {
    std::_Rb_tree_const_iterator<Catch::StringRef>::operator*
              ((_Rb_tree_const_iterator<Catch::StringRef> *)0x18be65);
    std::__cxx11::string::operator+=((string *)in_RDI,'[');
    rhs.m_size = in_RSI;
    rhs.m_start = (char *)psVar4;
    operator+=(in_RDI,rhs);
    std::__cxx11::string::operator+=((string *)in_RDI,']');
    std::_Rb_tree_const_iterator<Catch::StringRef>::operator++
              ((_Rb_tree_const_iterator<Catch::StringRef> *)in_RDI);
  }
  return psVar4;
}

Assistant:

std::string TagInfo::all() const {
        // 2 per tag for brackets '[' and ']'
        size_t size =  spellings.size() * 2;
        for (auto const& spelling : spellings) {
            size += spelling.size();
        }

        std::string out; out.reserve(size);
        for (auto const& spelling : spellings) {
            out += '[';
            out += spelling;
            out += ']';
        }
        return out;
    }